

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O2

void __thiscall Lib::DArray<char>::expand(DArray<char> *this,size_t s,char defVal)

{
  size_t i;
  ulong uVar1;
  
  uVar1 = this->_size;
  expand(this,s);
  if (uVar1 < s) {
    for (; uVar1 < s; uVar1 = uVar1 + 1) {
      this->_array[uVar1] = defVal;
    }
  }
  return;
}

Assistant:

void expand(size_t s, C defVal)
  {
    size_t oldSize = _size;
    expand(s);

    if(s<=oldSize) {
      return;
    }

    for(size_t i=oldSize; i<s; i++) {
      (*this)[i] = defVal;
    }
  }